

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::PipelineClassifier::SharedDtor(PipelineClassifier *this)

{
  Pipeline *this_00;
  Arena *pAVar1;
  LogMessage *other;
  PipelineClassifier *pPVar2;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  PipelineClassifier *local_10;
  PipelineClassifier *this_local;
  
  local_10 = this;
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar1 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/Model.pb.cc"
               ,0x1ad);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  pPVar2 = internal_default_instance();
  if ((this != pPVar2) && (this_00 = this->pipeline_, this_00 != (Pipeline *)0x0)) {
    Pipeline::~Pipeline(this_00);
    operator_delete(this_00,0x48);
  }
  return;
}

Assistant:

inline void PipelineClassifier::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete pipeline_;
}